

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

ssize_t send(int __fd,void *__buf,size_t __n,int __flags)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  size_t sVar6;
  rpchook_t *prVar7;
  ulong uVar8;
  pollfd pf;
  pollfd local_40;
  int local_34;
  
  if (g_sys_send_func == (send_pfn_t)0x0) {
    g_sys_send_func = (send_pfn_t)dlsym(0xffffffffffffffff,"send");
  }
  bVar3 = co_is_enable_sys_hook();
  if (bVar3) {
    if ((uint)__fd < 1000000) {
      prVar7 = g_rpchook_socket_fd[(uint)__fd];
    }
    else {
      prVar7 = (rpchook_t *)0x0;
    }
    if ((prVar7 != (rpchook_t *)0x0) && ((prVar7->user_flag & 0x800) == 0)) {
      _Var2 = (prVar7->write_timeout).tv_sec;
      auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar7->write_timeout).tv_usec);
      local_34 = __flags;
      uVar4 = (*g_sys_send_func)(__fd,__buf,__n,__flags);
      if (((long)uVar4 < 0) && (piVar5 = __errno_location(), *piVar5 == 0xb)) {
        uVar4 = 0;
      }
      if (-1 < (long)uVar4) {
        uVar8 = uVar4;
        if (uVar4 < __n) {
          do {
            local_40.events = 0x1c;
            local_40.fd = __fd;
            local_40.revents = 0;
            poll(&local_40,1,
                 ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + (int)_Var2 * 1000);
            uVar4 = (*g_sys_send_func)(__fd,(void *)((long)__buf + uVar8),__n - uVar8,local_34);
            if ((long)uVar4 < 1) {
              piVar5 = __errno_location();
              if (*piVar5 == 0xb) {
                *piVar5 = 0x7c5;
              }
            }
            else {
              uVar8 = uVar8 + uVar4;
            }
          } while ((0 < (long)uVar4) && (uVar8 < __n));
        }
        sVar6 = uVar4;
        if (0 < (long)uVar4) {
          sVar6 = uVar8;
        }
        uVar4 = uVar8;
        if (uVar8 == 0) {
          uVar4 = sVar6;
        }
      }
      return uVar4;
    }
  }
  sVar6 = (*g_sys_send_func)(__fd,__buf,__n,__flags);
  return sVar6;
}

Assistant:

ssize_t send(int socket, const void *buffer, size_t length, int flags)
{
	HOOK_SYS_FUNC( send );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_send_func( socket,buffer,length,flags );
	}
	rpchook_t *lp = get_by_fd( socket );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_send_func( socket,buffer,length,flags );
	}
	size_t wrotelen = 0;
	int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
				+ ( lp->write_timeout.tv_usec / 1000 );

	ssize_t writeret = g_sys_send_func( socket,buffer,length,flags );
	if(writeret <0 && (errno == EAGAIN || errno == EWOULDBLOCK )){
			//shouldn't usually happen, underlying device might be busy
			writeret = 0;
	}

	if(writeret<0){
		return writeret;
	}
	wrotelen+=writeret;

	while( wrotelen < length ){

		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		writeret = g_sys_send_func( socket,(const char*)buffer + wrotelen,length - wrotelen,flags );

		if( writeret <= 0 )
		{
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		wrotelen += writeret ;
	}
	if (writeret <= 0 && wrotelen == 0)
	{
		return writeret;
	}
	return wrotelen;
}